

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void * sys_aligned_alloc(size_t alignment,size_t size)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  uintptr_t diff;
  uintptr_t ap;
  void *p;
  size_t size_local;
  size_t alignment_local;
  
  pvVar1 = mmap((void *)0x0,size,3,0x22,-1,0);
  ap = (long)pvVar1 + 1U & 0xfffffffffffffffe;
  if ((alignment & alignment - 1) != 0) {
    __assert_fail("!(alignment & (alignment - 1)) && \"alignment must be a power of two\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                  ,0x188,"void *sys_aligned_alloc(size_t, size_t)");
  }
  if ((ap & alignment - 1) != 0) {
    munmap((void *)ap,size);
    sVar2 = page_size();
    pvVar1 = mmap((void *)0x0,(size + alignment) - sVar2,3,0x22,-1,0);
    pvVar1 = (void *)((long)pvVar1 + 1U & 0xfffffffffffffffe);
    if (pvVar1 != (void *)0x0) {
      pvVar3 = (void *)((long)pvVar1 + (alignment - 1) & (alignment - 1 ^ 0xffffffffffffffff));
      sVar4 = (long)pvVar3 - (long)pvVar1;
      if (sVar4 != 0) {
        munmap(pvVar1,sVar4);
      }
      sVar2 = page_size();
      sVar4 = (alignment - sVar2) - sVar4;
      if (-1 < (long)sVar4) {
        if (sVar4 == 0) {
          return pvVar3;
        }
        munmap((void *)((long)pvVar3 + size),sVar4);
        return pvVar3;
      }
      __assert_fail("(intptr_t)diff >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                    ,0x193,"void *sys_aligned_alloc(size_t, size_t)");
    }
    ap = 0;
  }
  return (void *)ap;
}

Assistant:

static void* sys_aligned_alloc(size_t alignment, size_t size)
{
	void* p = LTALLOC_VMALLOC(size);//optimistically try mapping precisely the right amount before falling back to the slow method
	LTALLOC_ASSERT(!(alignment & (alignment - 1)) && "alignment must be a power of two");
	if ((uintptr_t)p & (alignment - 1))
	{
		LTALLOC_VMFREE(p, size);
		p = LTALLOC_VMALLOC(size + alignment - LTALLOC_VMALLOC_MIN_SIZE());
		if (p)
		{
			uintptr_t ap = ((uintptr_t)p + (alignment - 1)) & ~(alignment - 1);
			uintptr_t diff = ap - (uintptr_t)p;
			if (diff) LTALLOC_VMFREE(p, diff);
			diff = alignment - LTALLOC_VMALLOC_MIN_SIZE() - diff;
			LTALLOC_ASSERT((intptr_t)diff >= 0);
			if (diff) LTALLOC_VMFREE((void*)(ap + size), diff);
			return (void*)ap;
		}
	}

	return p;
}